

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_types.h
# Opt level: O2

bool __thiscall
icu_63::numparse::impl::CompactUnicodeString<4>::operator==
          (CompactUnicodeString<4> *this,CompactUnicodeString<4> *other)

{
  UBool UVar1;
  UnicodeString UStack_88;
  UnicodeString local_48;
  
  toAliasedUnicodeString(&local_48,this);
  toAliasedUnicodeString(&UStack_88,other);
  UVar1 = UnicodeString::operator==(&local_48,&UStack_88);
  UnicodeString::~UnicodeString(&UStack_88);
  UnicodeString::~UnicodeString(&local_48);
  return UVar1 != '\0';
}

Assistant:

bool operator==(const CompactUnicodeString& other) const {
        // Use the alias-only constructor and then call UnicodeString operator==
        return toAliasedUnicodeString() == other.toAliasedUnicodeString();
    }